

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

xmlXPathObjectPtr xmlXPathCacheNewBoolean(xmlXPathContextPtr ctxt,int val)

{
  void *pvVar1;
  bool bVar2;
  xmlXPathObjectPtr pxVar3;
  int iVar4;
  
  if ((ctxt == (xmlXPathContextPtr)0x0) || (pvVar1 = ctxt->cache, pvVar1 == (void *)0x0))
  goto LAB_001e4fee;
  pxVar3 = *(xmlXPathObjectPtr *)((long)pvVar1 + 0x10);
  if ((pxVar3 == (xmlXPathObjectPtr)0x0) || (iVar4 = *(int *)&pxVar3->nodesetval, iVar4 == 0)) {
    pxVar3 = *(xmlXPathObjectPtr *)((long)pvVar1 + 0x20);
    bVar2 = true;
    if ((pxVar3 != (xmlXPathObjectPtr)0x0) && (iVar4 = *(int *)&pxVar3->nodesetval, iVar4 != 0))
    goto LAB_001e4fc5;
  }
  else {
LAB_001e4fc5:
    *(int *)&pxVar3->nodesetval = iVar4 + -1;
    pxVar3 = *(xmlXPathObjectPtr *)(*(long *)pxVar3 + -8 + (long)iVar4 * 8);
    pxVar3->type = XPATH_BOOLEAN;
    pxVar3->boolval = (uint)(val != 0);
    bVar2 = false;
  }
  if (!bVar2) {
    return pxVar3;
  }
LAB_001e4fee:
  pxVar3 = xmlXPathNewBoolean(val);
  return pxVar3;
}

Assistant:

static xmlXPathObjectPtr
xmlXPathCacheNewBoolean(xmlXPathContextPtr ctxt, int val)
{
    if ((ctxt != NULL) && (ctxt->cache)) {
	xmlXPathContextCachePtr cache = (xmlXPathContextCachePtr) ctxt->cache;

	if ((cache->booleanObjs != NULL) &&
	    (cache->booleanObjs->number != 0))
	{
	    xmlXPathObjectPtr ret;

	    ret = (xmlXPathObjectPtr)
		cache->booleanObjs->items[--cache->booleanObjs->number];
	    ret->type = XPATH_BOOLEAN;
	    ret->boolval = (val != 0);
#ifdef XP_DEBUG_OBJ_USAGE
	    xmlXPathDebugObjUsageRequested(ctxt, XPATH_BOOLEAN);
#endif
	    return(ret);
	} else if ((cache->miscObjs != NULL) &&
	    (cache->miscObjs->number != 0))
	{
	    xmlXPathObjectPtr ret;

	    ret = (xmlXPathObjectPtr)
		cache->miscObjs->items[--cache->miscObjs->number];

	    ret->type = XPATH_BOOLEAN;
	    ret->boolval = (val != 0);
#ifdef XP_DEBUG_OBJ_USAGE
	    xmlXPathDebugObjUsageRequested(ctxt, XPATH_BOOLEAN);
#endif
	    return(ret);
	}
    }
    return(xmlXPathNewBoolean(val));
}